

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

BasicBlock * __thiscall
FlowGraph::InsertAirlockBlock(FlowGraph *this,FlowEdge *edge,bool afterForward)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_00;
  RealCount *pRVar1;
  IRKind IVar2;
  OpCode OVar3;
  uint uVar4;
  BasicBlock *block;
  Type pFVar5;
  LabelInstr *pLVar6;
  Instr *this_01;
  Func *func;
  code *pcVar7;
  bool bVar8;
  BasicBlock *blockSucc;
  long lVar9;
  undefined4 *puVar10;
  Type *ppFVar11;
  BasicBlock *pBVar12;
  BranchInstr *pBVar13;
  Type pSVar14;
  LabelInstr *newLabelInstr;
  char *this_02;
  FlowEdge *edge_00;
  BasicBlock *pBVar15;
  Func **ppFVar16;
  BranchInstr *local_38;
  
  blockSucc = BasicBlock::New(this);
  pBVar15 = edge->predBlock;
  block = edge->succBlock;
  pBVar12 = pBVar15->next;
  ppFVar16 = (Func **)&pBVar12->firstInstr;
  if (pBVar12 == (BasicBlock *)0x0) {
    ppFVar16 = &pBVar15->func;
  }
  lVar9 = 0x18;
  if (pBVar12 == (BasicBlock *)0x0) {
    lVar9 = 0xd0;
  }
  local_38 = *(BranchInstr **)((long)&(*ppFVar16)->m_alloc + lVar9);
  if ((local_38->super_Instr).m_kind != InstrKindBranch) {
    this_00 = &pBVar15->succList;
    pSVar14 = (pBVar15->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
              super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar14 == this_00) ||
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar14->next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x87e,"(successors->HasOne())",
                         "Failed to normalize weird block before airlock");
      if (!bVar8) goto LAB_00418ea3;
      *puVar10 = 0;
    }
    ppFVar11 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar5 = *ppFVar11;
    if (pFVar5 != edge) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x880,"(onlyLink == edge)","Found duplicate of edge?");
      if (!bVar8) goto LAB_00418ea3;
      *puVar10 = 0;
    }
    pBVar12 = pFVar5->succBlock;
    if (pBVar12 != block) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x881,"(onlyLink->GetSucc() == sinkBlock)","State inconsistent");
      if (!bVar8) goto LAB_00418ea3;
      *puVar10 = 0;
      pBVar12 = pFVar5->succBlock;
    }
    pLVar6 = (LabelInstr *)pBVar12->firstInstr;
    IVar2 = (pLVar6->super_Instr).m_kind;
    if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar8) goto LAB_00418ea3;
      *puVar10 = 0;
    }
    pBVar13 = IR::BranchInstr::New(Br,pLVar6,(local_38->super_Instr).m_func);
    IR::Instr::InsertAfter(&local_38->super_Instr,&pBVar13->super_Instr);
    local_38 = (BranchInstr *)(local_38->super_Instr).m_next;
  }
  lVar9 = 0x18;
  pBVar12 = block->prev;
  ppFVar16 = (Func **)&pBVar12->next->firstInstr;
  if (pBVar12->next == (BasicBlock *)0x0) {
    lVar9 = 0xd0;
    ppFVar16 = &pBVar12->func;
  }
  this_01 = *(Instr **)((long)&(*ppFVar16)->m_alloc + lVar9);
  blockSucc->loop = block->loop;
  uVar4 = this->blockCount;
  this->blockCount = uVar4 + 1;
  blockSucc->number = uVar4;
  blockSucc->field_0x19 = blockSucc->field_0x19 | 2;
  blockSucc->prev = block->prev;
  block->prev = blockSucc;
  blockSucc->next = block;
  blockSucc->prev->next = blockSucc;
  BasicBlock::RemoveSucc(pBVar15,block,this,false,false);
  AddEdge(this,pBVar15,blockSucc);
  edge->predBlock = blockSucc;
  pSVar14 = (Type)new<Memory::ArenaAllocator>(0x10,&this->alloc->super_ArenaAllocator,0x364470);
  pSVar14[1].next = (Type)edge;
  pSVar14->next =
       (blockSucc->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  (blockSucc->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar14;
  pRVar1 = &(blockSucc->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  blockSucc->dataUseCount = 1;
  BasicBlock::DecrementDataUseCount(pBVar15);
  pLVar6 = (LabelInstr *)block->firstInstr;
  IVar2 = (pLVar6->super_Instr).m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar8) goto LAB_00418ea3;
    *puVar10 = 0;
  }
  func = (pLVar6->super_Instr).m_func;
  newLabelInstr = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(this_01,&newLabelInstr->super_Instr);
  blockSucc->firstInstr = &newLabelInstr->super_Instr;
  if (newLabelInstr->m_block != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                       "Overwriting existing block pointer");
    if (!bVar8) goto LAB_00418ea3;
    *puVar10 = 0;
  }
  newLabelInstr->m_block = blockSucc;
  pBVar13 = IR::BranchInstr::New(Br,pLVar6,func);
  IR::Instr::SetByteCodeOffset(&pBVar13->super_Instr,(Instr *)pLVar6);
  IR::Instr::InsertAfter(&newLabelInstr->super_Instr,&pBVar13->super_Instr);
  IR::Instr::SetByteCodeOffset(&newLabelInstr->super_Instr,(Instr *)pLVar6);
  if (afterForward) {
    newLabelInstr->m_region = pLVar6->m_region;
  }
  if ((local_38->super_Instr).m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar8) goto LAB_00418ea3;
    *puVar10 = 0;
  }
  this_02 = (char *)local_38->m_branchTarget;
  if ((LabelInstr *)this_02 == (LabelInstr *)0x0) {
    if (local_38->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
      if (!bVar8) goto LAB_00418ea3;
      *puVar10 = 0;
    }
    this_02 = (char *)IR::BranchInstr::AsMultiBrInstr(local_38);
    bVar8 = IR::MultiBranchInstr::ReplaceTarget((MultiBranchInstr *)this_02,pLVar6,newLabelInstr);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      this_02 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
      ;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x8cd,"(replaced)","replaced");
      if (!bVar8) goto LAB_00418ea3;
      *puVar10 = 0;
    }
  }
  else {
    if (local_38->m_isMultiBranch != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
      if (!bVar8) goto LAB_00418ea3;
      *puVar10 = 0;
      this_02 = (char *)local_38->m_branchTarget;
    }
    if ((LabelInstr *)this_02 == pLVar6) {
      if (local_38->m_isMultiBranch == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
        if (!bVar8) {
LAB_00418ea3:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar10 = 0;
        this_02 = (char *)local_38->m_branchTarget;
      }
      if ((LabelInstr *)this_02 != (LabelInstr *)0x0) {
        IR::LabelInstr::RemoveLabelRef((LabelInstr *)this_02,local_38);
      }
      this_02 = (char *)newLabelInstr;
      IR::LabelInstr::AddLabelRef(newLabelInstr,local_38);
      local_38->m_branchTarget = newLabelInstr;
    }
  }
  if (this_01->m_kind == InstrKindBranch) {
    OVar3 = this_01->m_opcode;
    if (OVar3 < ADD) {
      if ((OVar3 == Br) || (OVar3 == MultiBr)) goto LAB_00418e7d;
    }
    else {
      bVar8 = LowererMD::IsUnconditionalBranch(this_01);
      if (bVar8) goto LAB_00418e7d;
    }
    this_02 = (char *)(ulong)this_01->m_opcode;
    bVar8 = OpCodeAttr::HasFallThrough(this_01->m_opcode);
    if (!bVar8) goto LAB_00418e7d;
  }
  if (((pBVar12->field_0x18 & 1) == 0) &&
     (edge_00 = FindEdge((FlowGraph *)this_02,pBVar12,block), edge_00 != (FlowEdge *)0x0)) {
    pBVar15 = InsertCompensationCodeForBlockMove(this,edge_00,true,true,afterForward);
    pBVar15->dataUseCount = pBVar15->dataUseCount + 1;
    pBVar15->field_0x18 = pBVar15->field_0x18 | 0x40;
  }
LAB_00418e7d:
  Dump(this,true,L"\n After insertion of airlock block \n");
  return blockSucc;
}

Assistant:

BasicBlock *
FlowGraph::InsertAirlockBlock(FlowEdge * edge, bool afterForward /*= false*/)
{
    BasicBlock * airlockBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();

    IR::Instr * sourceLastInstr = sourceBlock->GetLastInstr();

    //
    // Normalize block
    //
    if(!sourceLastInstr->IsBranchInstr())
    {
        // There are some cases where the last instruction of a block can be not a branch;
        // for example, if it was previously a conditional branch that was impossible to take.
        // In these situations, we can insert an unconditional branch to fallthrough for that
        // block, to renormalize it.
        SListBaseCounted<FlowEdge*>* successors = sourceBlock->GetSuccList();
        // Only handling the case for one arc left at the moment; other cases are likely bugs.
        AssertOrFailFastMsg(successors->HasOne(), "Failed to normalize weird block before airlock");
        FlowEdge* onlyLink = successors->Head();
        AssertOrFailFastMsg(onlyLink == edge, "Found duplicate of edge?");
        AssertOrFailFastMsg(onlyLink->GetSucc() == sinkBlock, "State inconsistent");
        sourceLastInstr->InsertAfter(IR::BranchInstr::New(Js::OpCode::Br, onlyLink->GetSucc()->GetFirstInstr()->AsLabelInstr(), sourceLastInstr->m_func));
        sourceLastInstr = sourceLastInstr->m_next;
    }

    BasicBlock * sinkPrevBlock = sinkBlock->prev;
    IR::Instr *  sinkPrevBlockLastInstr = sinkPrevBlock->GetLastInstr();

    airlockBlock->loop = sinkBlock->loop;
    airlockBlock->SetBlockNum(this->blockCount++);
#ifdef DBG
    airlockBlock->isAirLockBlock = true;
#endif

    //
    // Fixup block linkage
    //

    // airlock block is inserted right before sourceBlock
    airlockBlock->prev = sinkBlock->prev;
    sinkBlock->prev = airlockBlock;

    airlockBlock->next = sinkBlock;
    airlockBlock->prev->next = airlockBlock;

    //
    // Fixup flow edges
    //

    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, airlockBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(airlockBlock);
    airlockBlock->AddSucc(edge, this);

    // Fixup data use count
    airlockBlock->SetDataUseCount(1);
    sourceBlock->DecrementDataUseCount();

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *airlockLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);

    sinkPrevBlockLastInstr->InsertAfter(airlockLabel);

    airlockBlock->SetFirstInstr(airlockLabel);
    airlockLabel->SetBasicBlock(airlockBlock);

    // Add br to sinkBlock from airlock block
    IR::BranchInstr *airlockBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    airlockBr->SetByteCodeOffset(sinkLabel);
    airlockLabel->InsertAfter(airlockBr);
    airlockBlock->SetLastInstr(airlockBr);

    airlockLabel->SetByteCodeOffset(sinkLabel);

    // If we have regions in play, we should update them on the airlock block appropriately
    if (afterForward)
    {
        airlockLabel->SetRegion(sinkLabel->GetRegion());
    }

    // Fixup flow out of sourceBlock
    IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
    if (sourceBr->IsMultiBranch())
    {
        const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, airlockLabel);
        Assert(replaced);
    }
    else if (sourceBr->GetTarget() == sinkLabel)
    {
        sourceBr->SetTarget(airlockLabel);
    }

    if (!sinkPrevBlockLastInstr->IsBranchInstr() || sinkPrevBlockLastInstr->AsBranchInstr()->HasFallThrough())
    {
        if (!sinkPrevBlock->isDeleted)
        {
            FlowEdge *dstEdge = this->FindEdge(sinkPrevBlock, sinkBlock);
            if (dstEdge) // Possibility that sourceblock may be same as sinkPrevBlock
            {
                BasicBlock* compensationBlock = this->InsertCompensationCodeForBlockMove(dstEdge, true /*insert comp block to loop list*/, true, afterForward);
                compensationBlock->IncrementDataUseCount();
                // We need to skip airlock compensation block in globopt as its inserted while globopt is iteration over the blocks.
                compensationBlock->isAirLockCompensationBlock = true;
            }
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n After insertion of airlock block \n"));
#endif

    return airlockBlock;
}